

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O1

void __thiscall Arena_Big_Test::TestBody(Arena_Big_Test *this)

{
  char *pcVar1;
  char *ptr;
  char *in_R9;
  Arena arena;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  AssertHelper local_68;
  Arena local_60;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30;
  
  memt::Arena::Arena(&local_60);
  if ((ulong)((long)local_60._blocks._block._end - (long)local_60._blocks._block._position) < 5) {
    memt::Arena::growCapacity(&local_60,5);
  }
  ptr = local_60._blocks._block._position;
  local_60._blocks._block._position = local_60._blocks._block._position + 8;
  if ((ulong)((long)local_60._blocks._block._end - (long)local_60._blocks._block._position) <
      0x100000) {
    memt::Arena::growCapacity(&local_60,0x100000);
  }
  pcVar1 = local_60._blocks._block._position;
  if (local_60._blocks._block._position + 0x100000 == local_60._blocks._block._begin) {
    local_60._blocks._block._position = local_60._blocks._block._position + 0x100000;
    memt::Arena::freeTopFromOldBlock(&local_60,pcVar1);
  }
  if ((ulong)((long)local_60._blocks._block._end - (long)local_60._blocks._block._position) <
      0x100000) {
    memt::Arena::growCapacity(&local_60,0x100000);
  }
  pcVar1 = local_60._blocks._block._position;
  if (local_60._blocks._block._position + 0x100000 == local_60._blocks._block._begin) {
    local_60._blocks._block._position = local_60._blocks._block._position + 0x100000;
    memt::Arena::freeTopFromOldBlock(&local_60,pcVar1);
  }
  local_40[0] = (internal)
                (local_60._blocks._block._begin != local_60._blocks._block._position ||
                local_60._blocks._block._previous != (Block *)0x0);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60._blocks._block._begin == local_60._blocks._block._position &&
      local_60._blocks._block._previous == (Block *)0x0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"arena.isEmpty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0x27,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
  }
  else {
    if (local_60._blocks._block._position == local_60._blocks._block._begin) {
      memt::Arena::freeTopFromOldBlock(&local_60,ptr);
      ptr = local_60._blocks._block._position;
    }
    local_60._blocks._block._position = ptr;
    local_40[0] = (internal)
                  (local_60._blocks._block._begin == local_60._blocks._block._position &&
                  local_60._blocks._block._previous == (Block *)0x0);
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_40[0]) goto LAB_0010d15a;
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"arena.isEmpty()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0x29,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_70._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))();
  }
LAB_0010d15a:
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  memt::Arena::~Arena(&local_60);
  return;
}

Assistant:

TEST(Arena, Big) {
  memt::Arena arena;
  void* a = arena.alloc(5);
  arena.freeTop(arena.alloc(1024 * 1024));
  arena.freeTop(arena.alloc(1024 * 1024));
  ASSERT_FALSE(arena.isEmpty());
  arena.freeTop(a);
  ASSERT_TRUE(arena.isEmpty());
}